

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

ostream * google::operator<<(ostream *os,PRIVATE_Counter *param_2)

{
  long lVar1;
  LogMessageFatal local_28;
  
  lVar1 = __dynamic_cast(os,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  if ((lVar1 != 0) && (lVar1 == *(long *)(lVar1 + 0x50))) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    return os;
  }
  LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
             ,0x7c7);
  std::__ostream_insert<char,std::char_traits<char>>
            (&((local_28.super_LogMessage.data_)->stream_).super_ostream,
             "Check failed: log && log == log->self() ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (&((local_28.super_LogMessage.data_)->stream_).super_ostream,
             "You must not use COUNTER with non-glog ostream",0x2e);
  LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

ostream& operator<<(ostream &os, const PRIVATE_Counter&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream *log = static_cast<LogMessage::LogStream*>(&os);
#else
  LogMessage::LogStream *log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}